

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

int xmlSchemaGetCanonValue(xmlSchemaValPtr val,xmlChar **retValue)

{
  double *pdVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  xmlSchemaValPtr pxVar10;
  xmlChar *pxVar11;
  xmlChar *pxVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 in_stack_fffffffffffffd58;
  undefined4 uVar18;
  undefined8 in_stack_fffffffffffffd60;
  undefined4 uVar19;
  xmlChar local_268 [8];
  char buf_8 [40];
  xmlChar local_238 [8];
  char buf_7 [30];
  xmlSchemaValPtr norm_2;
  char buf_6 [50];
  xmlSchemaValPtr norm_1;
  char buf_5 [30];
  xmlSchemaValPtr norm;
  char buf_4 [30];
  char buf_3 [35];
  xmlChar local_148 [8];
  char buf_2 [30];
  double left;
  double sec;
  unsigned_long min;
  unsigned_long hour;
  unsigned_long day;
  unsigned_long mon;
  unsigned_long year;
  char buf_1 [100];
  int bufsize_1;
  xmlSchemaValDecimal dec_1;
  uint i;
  int diff;
  char *offs;
  char *buf;
  int bufsize;
  xmlSchemaValDecimal dec;
  xmlChar **retValue_local;
  xmlSchemaValPtr val_local;
  
  uVar19 = (undefined4)((ulong)in_stack_fffffffffffffd60 >> 0x20);
  uVar18 = (undefined4)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  if ((retValue == (xmlChar **)0x0) || (val == (xmlSchemaValPtr)0x0)) {
    val_local._4_4_ = -1;
  }
  else {
    *retValue = (xmlChar *)0x0;
    switch(val->type) {
    case XML_SCHEMAS_STRING:
      if ((val->value).decimal.lo == 0) {
        pxVar11 = xmlStrdup("");
        *retValue = pxVar11;
      }
      else {
        pxVar11 = xmlStrdup((val->value).qname.name);
        *retValue = pxVar11;
      }
      break;
    case XML_SCHEMAS_NORMSTRING:
      if ((val->value).decimal.lo == 0) {
        pxVar11 = xmlStrdup("");
        *retValue = pxVar11;
      }
      else {
        pxVar11 = xmlSchemaWhiteSpaceReplace((val->value).qname.name);
        *retValue = pxVar11;
        if (*retValue == (xmlChar *)0x0) {
          pxVar11 = xmlStrdup((val->value).qname.name);
          *retValue = pxVar11;
        }
      }
      break;
    case XML_SCHEMAS_DECIMAL:
      if ((*(ushort *)((long)&val->value + 0x1c) >> 8 == 1) && ((val->value).decimal.lo == 0)) {
        pxVar11 = xmlStrdup((xmlChar *)"0.0");
        *retValue = pxVar11;
      }
      else {
        uVar3 = (val->value).decimal.lo;
        uVar4 = (val->value).decimal.mi;
        uVar2 = (val->value).decimal.hi;
        uVar6 = *(ulong *)((long)&val->value + 0x18);
        dec.hi._4_2_ = (ushort)(uVar6 >> 0x20);
        buf._4_4_ = (dec.hi._4_2_ >> 8) + 2;
        if ((uVar6 & 0x100000000) != 0) {
          buf._4_4_ = (dec.hi._4_2_ >> 8) + 3;
        }
        if (((dec.hi._4_2_ >> 1 & 0x7f) == 0) || ((dec.hi._4_2_ >> 1 & 0x7f) == dec.hi._4_2_ >> 8))
        {
          buf._4_4_ = buf._4_4_ + 1;
        }
        pxVar11 = (xmlChar *)(*xmlMalloc)((size_t)buf._4_4_);
        if (pxVar11 == (xmlChar *)0x0) {
          return -1;
        }
        _i = pxVar11;
        if ((uVar6 & 0x100000000) != 0) {
          _i = pxVar11 + 1;
          *pxVar11 = '-';
        }
        if ((dec.hi._4_2_ >> 1 & 0x7f) == dec.hi._4_2_ >> 8) {
          pxVar12 = _i + 1;
          *_i = '0';
          _i = _i + 2;
          *pxVar12 = '.';
        }
        if (uVar2 == 0) {
          if (uVar4 == 0) {
            snprintf((char *)_i,(long)buf._4_4_ - ((long)_i - (long)pxVar11),"%lu",uVar3);
          }
          else {
            snprintf((char *)_i,(long)buf._4_4_ - ((long)_i - (long)pxVar11),"%lu%lu",uVar4,uVar3);
          }
        }
        else {
          snprintf((char *)_i,(long)buf._4_4_ - ((long)_i - (long)pxVar11),"%lu%lu%lu",uVar2,uVar4,
                   uVar3);
        }
        if ((dec.hi._4_2_ >> 1 & 0x7f) == 0) {
          pxVar11[(long)buf._4_4_ + -1] = '\0';
          pxVar11[(long)buf._4_4_ + -2] = '0';
          pxVar11[(long)buf._4_4_ + -3] = '.';
        }
        else if ((dec.hi._4_2_ >> 1 & 0x7f) == dec.hi._4_2_ >> 8) {
          for (dec_1.extra = 0; _i[dec_1.extra] != '\0'; dec_1.extra = dec_1.extra + 1) {
          }
          if (dec_1.extra < dec.hi._4_2_ >> 8) {
            memmove(_i + ((dec.hi._4_2_ >> 8) - dec_1.extra),_i,(ulong)(dec_1.extra + 1));
            memset(_i,0x30,(ulong)((dec.hi._4_2_ >> 8) - dec_1.extra));
          }
        }
        else {
          iVar5 = (uint)(dec.hi._4_2_ >> 8) - (uint)(dec.hi._4_2_ >> 1 & 0x7f);
          memmove(_i + (long)iVar5 + 1,_i + iVar5,(long)(int)((dec.hi._4_2_ >> 1 & 0x7f) + 1));
          _i[iVar5] = '.';
        }
        *retValue = pxVar11;
      }
      break;
    case XML_SCHEMAS_TIME:
      if ((*(ushort *)((long)&val->value + 0x18) & 1) == 0) {
        snprintf((char *)&norm,0x1e,"%02u:%02u:%02.14g",(val->value).decimal.hi,
                 (ulong)((val->value).hex.total >> 9 & 0x1f),
                 (ulong)((val->value).hex.total >> 0xe & 0x3f));
      }
      else {
        pxVar10 = xmlSchemaDateNormalize(val,0.0);
        if (pxVar10 == (xmlSchemaValPtr)0x0) {
          return -1;
        }
        snprintf((char *)&norm,0x1e,"%02u:%02u:%02.14gZ",(pxVar10->value).decimal.hi,
                 (ulong)((pxVar10->value).hex.total >> 9 & 0x1f),
                 (ulong)((pxVar10->value).hex.total >> 0xe & 0x3f));
        xmlSchemaFreeValue(pxVar10);
      }
      pxVar11 = xmlStrdup((xmlChar *)&norm);
      *retValue = pxVar11;
      break;
    case XML_SCHEMAS_GDAY:
      pxVar11 = (xmlChar *)(*xmlMalloc)(6);
      *retValue = pxVar11;
      if (*retValue == (xmlChar *)0x0) {
        return -1;
      }
      snprintf((char *)*retValue,6,"---%02u",(ulong)((val->value).hex.total >> 4 & 0x1f));
      break;
    case XML_SCHEMAS_GMONTH:
      pxVar11 = (xmlChar *)(*xmlMalloc)(6);
      *retValue = pxVar11;
      if (*retValue == (xmlChar *)0x0) {
        return -1;
      }
      snprintf((char *)*retValue,6,"--%02u",(ulong)((val->value).hex.total & 0xf));
      break;
    case XML_SCHEMAS_GMONTHDAY:
      pxVar11 = (xmlChar *)(*xmlMalloc)(8);
      *retValue = pxVar11;
      if (*retValue == (xmlChar *)0x0) {
        return -1;
      }
      snprintf((char *)*retValue,8,"--%02u-%02u",(ulong)((val->value).hex.total & 0xf),
               (ulong)((val->value).hex.total >> 4 & 0x1f));
      break;
    case XML_SCHEMAS_GYEAR:
      snprintf((char *)local_148,0x1e,"%04ld",(val->value).decimal.lo);
      pxVar11 = xmlStrdup(local_148);
      *retValue = pxVar11;
      break;
    case XML_SCHEMAS_GYEARMONTH:
      if ((val->value).date.year < 0) {
        lVar7 = (val->value).date.year;
        if (lVar7 < 1) {
          lVar7 = -lVar7;
        }
        snprintf(buf_4 + 0x18,0x23,"-%04ld-%02u",lVar7,(ulong)((val->value).hex.total & 0xf));
      }
      else {
        snprintf(buf_4 + 0x18,0x23,"%04ld-%02u",(val->value).decimal.lo,
                 (ulong)((val->value).hex.total & 0xf));
      }
      pxVar11 = xmlStrdup((xmlChar *)(buf_4 + 0x18));
      *retValue = pxVar11;
      break;
    case XML_SCHEMAS_DATE:
      if ((*(ushort *)((long)&val->value + 0x18) & 1) == 0) {
        snprintf((char *)&norm_1,0x1e,"%04ld-%02u-%02u",(val->value).decimal.lo,
                 (ulong)((val->value).hex.total & 0xf),(ulong)((val->value).hex.total >> 4 & 0x1f));
      }
      else {
        register0x00000000 = xmlSchemaDateNormalize(val,0.0);
        if (register0x00000000 == (xmlSchemaValPtr)0x0) {
          return -1;
        }
        snprintf((char *)&norm_1,0x1e,"%04ld-%02u-%02uZ",(register0x00000000->value).decimal.lo,
                 (ulong)((register0x00000000->value).hex.total & 0xf),
                 (ulong)((register0x00000000->value).hex.total >> 4 & 0x1f));
        xmlSchemaFreeValue(stack0xfffffffffffffe30);
      }
      pxVar11 = xmlStrdup((xmlChar *)&norm_1);
      *retValue = pxVar11;
      break;
    case XML_SCHEMAS_DATETIME:
      if ((*(ushort *)((long)&val->value + 0x18) & 1) == 0) {
        snprintf((char *)&norm_2,0x32,"%04ld-%02u-%02uT%02u:%02u:%02.14g",(val->value).decimal.hi,
                 (val->value).decimal.lo,(ulong)((val->value).hex.total & 0xf),
                 (ulong)((val->value).hex.total >> 4 & 0x1f),
                 CONCAT44(uVar18,(val->value).hex.total >> 9) & 0xffffffff0000001f,
                 CONCAT44(uVar19,(val->value).hex.total >> 0xe) & 0xffffffff0000003f);
      }
      else {
        pxVar10 = xmlSchemaDateNormalize(val,0.0);
        if (pxVar10 == (xmlSchemaValPtr)0x0) {
          return -1;
        }
        snprintf((char *)&norm_2,0x32,"%04ld-%02u-%02uT%02u:%02u:%02.14gZ",
                 (pxVar10->value).decimal.hi,(pxVar10->value).decimal.lo,
                 (ulong)((pxVar10->value).hex.total & 0xf),
                 (ulong)((pxVar10->value).hex.total >> 4 & 0x1f),
                 CONCAT44(uVar18,(pxVar10->value).hex.total >> 9) & 0xffffffff0000001f,
                 CONCAT44(uVar19,(pxVar10->value).hex.total >> 0xe) & 0xffffffff0000003f);
        xmlSchemaFreeValue(pxVar10);
      }
      pxVar11 = xmlStrdup((xmlChar *)&norm_2);
      *retValue = pxVar11;
      break;
    case XML_SCHEMAS_DURATION:
      min = 0;
      sec = 0.0;
      left = 0.0;
      lVar7 = (val->value).date.year;
      if (lVar7 < 1) {
        lVar7 = -lVar7;
      }
      dVar13 = floor((double)lVar7 / 12.0);
      uVar6 = (long)dVar13 | (long)(dVar13 - 9.223372036854776e+18) & (long)dVar13 >> 0x3f;
      lVar7 = (val->value).date.year;
      if (lVar7 < 1) {
        lVar7 = -lVar7;
      }
      lVar7 = lVar7 + uVar6 * -0xc;
      dVar13 = floor(ABS((val->value).date.sec) / 86400.0);
      uVar8 = (long)dVar13 | (long)(dVar13 - 9.223372036854776e+18) & (long)dVar13 >> 0x3f;
      lVar9 = uVar8 * 0x15180;
      auVar15._8_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar15._0_8_ = lVar9;
      auVar15._12_4_ = 0x45300000;
      dVar13 = ABS((val->value).date.sec) -
               ((auVar15._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
      if (0.0 < dVar13) {
        dVar14 = floor(dVar13 / 3600.0);
        min = (long)dVar14 | (long)(dVar14 - 9.223372036854776e+18) & (long)dVar14 >> 0x3f;
        lVar9 = min * 0xe10;
        auVar16._8_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar16._0_8_ = lVar9;
        auVar16._12_4_ = 0x45300000;
        dVar13 = dVar13 - ((auVar16._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
        if (0.0 < dVar13) {
          dVar14 = floor(dVar13 / 60.0);
          sec = (double)((long)dVar14 |
                        (long)(dVar14 - 9.223372036854776e+18) & (long)dVar14 >> 0x3f);
          lVar9 = (long)sec * 0x3c;
          auVar17._8_4_ = (int)((ulong)lVar9 >> 0x20);
          auVar17._0_8_ = lVar9;
          auVar17._12_4_ = 0x45300000;
          left = dVar13 - ((auVar17._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
        }
      }
      if (((val->value).date.year < 0) ||
         (pdVar1 = &(val->value).date.sec, *pdVar1 <= 0.0 && *pdVar1 != 0.0)) {
        snprintf((char *)&year,100,"P%luY%luM%luDT%luH%luM%.14gS",left,uVar6,lVar7,uVar8,min,sec);
      }
      else {
        snprintf((char *)&year,100,"-P%luY%luM%luDT%luH%luM%.14gS",left,uVar6,lVar7,uVar8,min,sec);
      }
      pxVar11 = xmlStrdup((xmlChar *)&year);
      *retValue = pxVar11;
      break;
    case XML_SCHEMAS_FLOAT:
      snprintf((char *)local_238,0x1e,"%01.14e",(double)(val->value).f);
      pxVar11 = xmlStrdup(local_238);
      *retValue = pxVar11;
      break;
    case XML_SCHEMAS_DOUBLE:
      snprintf((char *)local_268,0x28,"%01.14e",(val->value).decimal.lo);
      pxVar11 = xmlStrdup(local_268);
      *retValue = pxVar11;
      break;
    case XML_SCHEMAS_BOOLEAN:
      if ((val->value).b == 0) {
        pxVar11 = xmlStrdup((xmlChar *)"false");
        *retValue = pxVar11;
      }
      else {
        pxVar11 = xmlStrdup((xmlChar *)"true");
        *retValue = pxVar11;
      }
      break;
    case XML_SCHEMAS_TOKEN:
    case XML_SCHEMAS_LANGUAGE:
    case XML_SCHEMAS_NMTOKEN:
    case XML_SCHEMAS_NAME:
    case XML_SCHEMAS_NCNAME:
    case XML_SCHEMAS_ID:
    case XML_SCHEMAS_IDREF:
    case XML_SCHEMAS_ENTITY:
    case XML_SCHEMAS_NOTATION:
    case XML_SCHEMAS_ANYURI:
      if ((val->value).decimal.lo == 0) {
        return -1;
      }
      pxVar11 = xmlSchemaCollapseString((val->value).qname.name);
      *retValue = pxVar11;
      if (*retValue == (xmlChar *)0x0) {
        pxVar11 = xmlStrdup((val->value).qname.name);
        *retValue = pxVar11;
      }
      break;
    default:
      pxVar11 = xmlStrdup((xmlChar *)"???");
      *retValue = pxVar11;
      return 1;
    case XML_SCHEMAS_QNAME:
      if ((val->value).decimal.mi == 0) {
        pxVar11 = xmlStrdup((val->value).qname.name);
        *retValue = pxVar11;
        return 0;
      }
      pxVar11 = xmlStrdup((xmlChar *)"{");
      *retValue = pxVar11;
      pxVar11 = xmlStrcat(*retValue,(val->value).qname.uri);
      *retValue = pxVar11;
      pxVar11 = xmlStrcat(*retValue,"}");
      *retValue = pxVar11;
      pxVar11 = xmlStrcat(*retValue,(val->value).qname.uri);
      *retValue = pxVar11;
      break;
    case XML_SCHEMAS_INTEGER:
    case XML_SCHEMAS_NPINTEGER:
    case XML_SCHEMAS_NINTEGER:
    case XML_SCHEMAS_NNINTEGER:
    case XML_SCHEMAS_PINTEGER:
    case XML_SCHEMAS_INT:
    case XML_SCHEMAS_UINT:
    case XML_SCHEMAS_LONG:
    case XML_SCHEMAS_ULONG:
    case XML_SCHEMAS_SHORT:
    case XML_SCHEMAS_USHORT:
    case XML_SCHEMAS_BYTE:
    case XML_SCHEMAS_UBYTE:
      if ((*(ushort *)((long)&val->value + 0x1c) >> 8 == 1) && ((val->value).decimal.lo == 0)) {
        pxVar11 = xmlStrdup("0");
        *retValue = pxVar11;
      }
      else {
        unique0x00012000 = (val->value).decimal.lo;
        uVar3 = (val->value).decimal.mi;
        uVar4 = (val->value).decimal.hi;
        uVar6 = *(ulong *)((long)&val->value + 0x18);
        dec_1.hi._4_2_ = (ushort)(uVar6 >> 0x20);
        buf_1._92_4_ = (dec_1.hi._4_2_ >> 8) + 1;
        if ((uVar6 & 0x100000000) != 0) {
          buf_1._92_4_ = (dec_1.hi._4_2_ >> 8) + 2;
        }
        pxVar11 = (xmlChar *)(*xmlMalloc)((size_t)buf_1._92_4_);
        *retValue = pxVar11;
        if (*retValue == (xmlChar *)0x0) {
          return -1;
        }
        if (uVar4 == 0) {
          if (uVar3 == 0) {
            if ((uVar6 & 0x100000000) == 0) {
              snprintf((char *)*retValue,(long)(int)buf_1._92_4_,"%lu",stack0xffffffffffffff80);
            }
            else {
              snprintf((char *)*retValue,(long)(int)buf_1._92_4_,"-%lu",stack0xffffffffffffff80);
            }
          }
          else if ((uVar6 & 0x100000000) == 0) {
            snprintf((char *)*retValue,(long)(int)buf_1._92_4_,"%lu%lu",uVar3,
                     stack0xffffffffffffff80);
          }
          else {
            snprintf((char *)*retValue,(long)(int)buf_1._92_4_,"-%lu%lu",uVar3,
                     stack0xffffffffffffff80);
          }
        }
        else if ((uVar6 & 0x100000000) == 0) {
          snprintf((char *)*retValue,(long)(int)buf_1._92_4_,"%lu%lu%lu",uVar4,uVar3,
                   stack0xffffffffffffff80);
        }
        else {
          snprintf((char *)*retValue,(long)(int)buf_1._92_4_,"-%lu%lu%lu",uVar4,uVar3,
                   stack0xffffffffffffff80);
        }
      }
      break;
    case XML_SCHEMAS_HEXBINARY:
      pxVar11 = xmlStrdup((val->value).qname.name);
      *retValue = pxVar11;
      break;
    case XML_SCHEMAS_BASE64BINARY:
      pxVar11 = xmlStrdup((val->value).qname.name);
      *retValue = pxVar11;
    }
    if (*retValue == (xmlChar *)0x0) {
      val_local._4_4_ = -1;
    }
    else {
      val_local._4_4_ = 0;
    }
  }
  return val_local._4_4_;
}

Assistant:

int
xmlSchemaGetCanonValue(xmlSchemaValPtr val, const xmlChar **retValue)
{
    if ((retValue == NULL) || (val == NULL))
	return (-1);
    *retValue = NULL;
    switch (val->type) {
	case XML_SCHEMAS_STRING:
	    if (val->value.str == NULL)
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "");
	    else
		*retValue =
		    BAD_CAST xmlStrdup((const xmlChar *) val->value.str);
	    break;
	case XML_SCHEMAS_NORMSTRING:
	    if (val->value.str == NULL)
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "");
	    else {
		*retValue = xmlSchemaWhiteSpaceReplace(
		    (const xmlChar *) val->value.str);
		if ((*retValue) == NULL)
		    *retValue = BAD_CAST xmlStrdup(
			(const xmlChar *) val->value.str);
	    }
	    break;
	case XML_SCHEMAS_TOKEN:
	case XML_SCHEMAS_LANGUAGE:
	case XML_SCHEMAS_NMTOKEN:
	case XML_SCHEMAS_NAME:
	case XML_SCHEMAS_NCNAME:
	case XML_SCHEMAS_ID:
	case XML_SCHEMAS_IDREF:
	case XML_SCHEMAS_ENTITY:
	case XML_SCHEMAS_NOTATION: /* Unclear */
	case XML_SCHEMAS_ANYURI:   /* Unclear */
	    if (val->value.str == NULL)
		return (-1);
	    *retValue =
		BAD_CAST xmlSchemaCollapseString(BAD_CAST val->value.str);
	    if (*retValue == NULL)
		*retValue =
		    BAD_CAST xmlStrdup((const xmlChar *) val->value.str);
	    break;
	case XML_SCHEMAS_QNAME:
	    /* TODO: Unclear in XML Schema 1.0. */
	    if (val->value.qname.uri == NULL) {
		*retValue = BAD_CAST xmlStrdup(BAD_CAST val->value.qname.name);
		return (0);
	    } else {
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "{");
		*retValue = BAD_CAST xmlStrcat((xmlChar *) (*retValue),
		    BAD_CAST val->value.qname.uri);
		*retValue = BAD_CAST xmlStrcat((xmlChar *) (*retValue),
		    BAD_CAST "}");
		*retValue = BAD_CAST xmlStrcat((xmlChar *) (*retValue),
		    BAD_CAST val->value.qname.uri);
	    }
	    break;
	case XML_SCHEMAS_DECIMAL:
	    /*
	    * TODO: Lookout for a more simple implementation.
	    */
	    if ((val->value.decimal.total == 1) &&
		(val->value.decimal.lo == 0)) {
		*retValue = xmlStrdup(BAD_CAST "0.0");
	    } else {
		xmlSchemaValDecimal dec = val->value.decimal;
		int bufsize;
		char *buf = NULL, *offs;

		/* Add room for the decimal point as well. */
		bufsize = dec.total + 2;
		if (dec.sign)
		    bufsize++;
		/* Add room for leading/trailing zero. */
		if ((dec.frac == 0) || (dec.frac == dec.total))
		    bufsize++;
		buf = xmlMalloc(bufsize);
		if (buf == NULL)
		    return(-1);
		offs = buf;
		if (dec.sign)
		    *offs++ = '-';
		if (dec.frac == dec.total) {
		    *offs++ = '0';
		    *offs++ = '.';
		}
		if (dec.hi != 0)
		    snprintf(offs, bufsize - (offs - buf),
			"%lu%lu%lu", dec.hi, dec.mi, dec.lo);
		else if (dec.mi != 0)
		    snprintf(offs, bufsize - (offs - buf),
			"%lu%lu", dec.mi, dec.lo);
		else
		    snprintf(offs, bufsize - (offs - buf),
			"%lu", dec.lo);

		if (dec.frac != 0) {
		    if (dec.frac != dec.total) {
			int diff = dec.total - dec.frac;
			/*
			* Insert the decimal point.
			*/
			memmove(offs + diff + 1, offs + diff, dec.frac +1);
			offs[diff] = '.';
		    } else {
			unsigned int i = 0;
			/*
			* Insert missing zeroes behind the decimal point.
			*/
			while (*(offs + i) != 0)
			    i++;
			if (i < dec.total) {
			    memmove(offs + (dec.total - i), offs, i +1);
			    memset(offs, '0', dec.total - i);
			}
		    }
		} else {
		    /*
		    * Append decimal point and zero.
		    */
		    offs = buf + bufsize - 1;
		    *offs-- = 0;
		    *offs-- = '0';
		    *offs-- = '.';
		}
		*retValue = BAD_CAST buf;
	    }
	    break;
	case XML_SCHEMAS_INTEGER:
        case XML_SCHEMAS_PINTEGER:
        case XML_SCHEMAS_NPINTEGER:
        case XML_SCHEMAS_NINTEGER:
        case XML_SCHEMAS_NNINTEGER:
	case XML_SCHEMAS_LONG:
        case XML_SCHEMAS_BYTE:
        case XML_SCHEMAS_SHORT:
        case XML_SCHEMAS_INT:
	case XML_SCHEMAS_UINT:
        case XML_SCHEMAS_ULONG:
        case XML_SCHEMAS_USHORT:
        case XML_SCHEMAS_UBYTE:
	    if ((val->value.decimal.total == 1) &&
		(val->value.decimal.lo == 0))
		*retValue = xmlStrdup(BAD_CAST "0");
	    else {
		xmlSchemaValDecimal dec = val->value.decimal;
		int bufsize = dec.total + 1;

		/* Add room for the decimal point as well. */
		if (dec.sign)
		    bufsize++;
		*retValue = xmlMalloc(bufsize);
		if (*retValue == NULL)
		    return(-1);
		if (dec.hi != 0) {
		    if (dec.sign)
			snprintf((char *) *retValue, bufsize,
			    "-%lu%lu%lu", dec.hi, dec.mi, dec.lo);
		    else
			snprintf((char *) *retValue, bufsize,
			    "%lu%lu%lu", dec.hi, dec.mi, dec.lo);
		} else if (dec.mi != 0) {
		    if (dec.sign)
			snprintf((char *) *retValue, bufsize,
			    "-%lu%lu", dec.mi, dec.lo);
		    else
			snprintf((char *) *retValue, bufsize,
			    "%lu%lu", dec.mi, dec.lo);
		} else {
		    if (dec.sign)
			snprintf((char *) *retValue, bufsize, "-%lu", dec.lo);
		    else
			snprintf((char *) *retValue, bufsize, "%lu", dec.lo);
		}
	    }
	    break;
	case XML_SCHEMAS_BOOLEAN:
	    if (val->value.b)
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "true");
	    else
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "false");
	    break;
	case XML_SCHEMAS_DURATION: {
		char buf[100];
		unsigned long year;
		unsigned long mon, day, hour = 0, min = 0;
		double sec = 0, left;

		/* TODO: Unclear in XML Schema 1.0 */
		/*
		* TODO: This results in a normalized output of the value
		* - which is NOT conformant to the spec -
		* since the exact values of each property are not
		* recoverable. Think about extending the structure to
		* provide a field for every property.
		*/
		year = (unsigned long) FQUOTIENT(labs(val->value.dur.mon), 12);
		mon = labs(val->value.dur.mon) - 12 * year;

		day = (unsigned long) FQUOTIENT(fabs(val->value.dur.sec), 86400);
		left = fabs(val->value.dur.sec) - day * 86400;
		if (left > 0) {
		    hour = (unsigned long) FQUOTIENT(left, 3600);
		    left = left - (hour * 3600);
		    if (left > 0) {
			min = (unsigned long) FQUOTIENT(left, 60);
			sec = left - (min * 60);
		    }
		}
		if ((val->value.dur.mon < 0) || (val->value.dur.sec < 0))
		    snprintf(buf, 100, "P%luY%luM%luDT%luH%luM%.14gS",
			year, mon, day, hour, min, sec);
		else
		    snprintf(buf, 100, "-P%luY%luM%luDT%luH%luM%.14gS",
			year, mon, day, hour, min, sec);
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	case XML_SCHEMAS_GYEAR: {
		char buf[30];
		/* TODO: Unclear in XML Schema 1.0 */
		/* TODO: What to do with the timezone? */
		snprintf(buf, 30, "%04ld", val->value.date.year);
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	case XML_SCHEMAS_GMONTH: {
		/* TODO: Unclear in XML Schema 1.0 */
		/* TODO: What to do with the timezone? */
		*retValue = xmlMalloc(6);
		if (*retValue == NULL)
		    return(-1);
		snprintf((char *) *retValue, 6, "--%02u",
		    val->value.date.mon);
	    }
	    break;
        case XML_SCHEMAS_GDAY: {
		/* TODO: Unclear in XML Schema 1.0 */
		/* TODO: What to do with the timezone? */
		*retValue = xmlMalloc(6);
		if (*retValue == NULL)
		    return(-1);
		snprintf((char *) *retValue, 6, "---%02u",
		    val->value.date.day);
	    }
	    break;
        case XML_SCHEMAS_GMONTHDAY: {
		/* TODO: Unclear in XML Schema 1.0 */
		/* TODO: What to do with the timezone? */
		*retValue = xmlMalloc(8);
		if (*retValue == NULL)
		    return(-1);
		snprintf((char *) *retValue, 8, "--%02u-%02u",
		    val->value.date.mon, val->value.date.day);
	    }
	    break;
        case XML_SCHEMAS_GYEARMONTH: {
		char buf[35];
		/* TODO: Unclear in XML Schema 1.0 */
		/* TODO: What to do with the timezone? */
		if (val->value.date.year < 0)
		    snprintf(buf, 35, "-%04ld-%02u",
			labs(val->value.date.year),
			val->value.date.mon);
		else
		    snprintf(buf, 35, "%04ld-%02u",
			val->value.date.year, val->value.date.mon);
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	case XML_SCHEMAS_TIME:
	    {
		char buf[30];

		if (val->value.date.tz_flag) {
		    xmlSchemaValPtr norm;

		    norm = xmlSchemaDateNormalize(val, 0);
		    if (norm == NULL)
			return (-1);
		    /*
		    * TODO: Check if "%.14g" is portable.
		    */
		    snprintf(buf, 30,
			"%02u:%02u:%02.14gZ",
			norm->value.date.hour,
			norm->value.date.min,
			norm->value.date.sec);
		    xmlSchemaFreeValue(norm);
		} else {
		    snprintf(buf, 30,
			"%02u:%02u:%02.14g",
			val->value.date.hour,
			val->value.date.min,
			val->value.date.sec);
		}
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
        case XML_SCHEMAS_DATE:
	    {
		char buf[30];

		if (val->value.date.tz_flag) {
		    xmlSchemaValPtr norm;

		    norm = xmlSchemaDateNormalize(val, 0);
		    if (norm == NULL)
			return (-1);
		    /*
		    * TODO: Append the canonical value of the
		    * recoverable timezone and not "Z".
		    */
		    snprintf(buf, 30,
			"%04ld-%02u-%02uZ",
			norm->value.date.year, norm->value.date.mon,
			norm->value.date.day);
		    xmlSchemaFreeValue(norm);
		} else {
		    snprintf(buf, 30,
			"%04ld-%02u-%02u",
			val->value.date.year, val->value.date.mon,
			val->value.date.day);
		}
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
        case XML_SCHEMAS_DATETIME:
	    {
		char buf[50];

		if (val->value.date.tz_flag) {
		    xmlSchemaValPtr norm;

		    norm = xmlSchemaDateNormalize(val, 0);
		    if (norm == NULL)
			return (-1);
		    /*
		    * TODO: Check if "%.14g" is portable.
		    */
		    snprintf(buf, 50,
			"%04ld-%02u-%02uT%02u:%02u:%02.14gZ",
			norm->value.date.year, norm->value.date.mon,
			norm->value.date.day, norm->value.date.hour,
			norm->value.date.min, norm->value.date.sec);
		    xmlSchemaFreeValue(norm);
		} else {
		    snprintf(buf, 50,
			"%04ld-%02u-%02uT%02u:%02u:%02.14g",
			val->value.date.year, val->value.date.mon,
			val->value.date.day, val->value.date.hour,
			val->value.date.min, val->value.date.sec);
		}
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	case XML_SCHEMAS_HEXBINARY:
	    *retValue = BAD_CAST xmlStrdup(BAD_CAST val->value.hex.str);
	    break;
	case XML_SCHEMAS_BASE64BINARY:
	    /*
	    * TODO: Is the following spec piece implemented?:
	    * SPEC: "Note: For some values the canonical form defined
	    * above does not conform to [RFC 2045], which requires breaking
	    * with linefeeds at appropriate intervals."
	    */
	    *retValue = BAD_CAST xmlStrdup(BAD_CAST val->value.base64.str);
	    break;
	case XML_SCHEMAS_FLOAT: {
		char buf[30];
		/*
		* |m| < 16777216, -149 <= e <= 104.
		* TODO: Handle, NaN, INF, -INF. The format is not
		* yet conformant. The c type float does not cover
		* the whole range.
		*/
		snprintf(buf, 30, "%01.14e", val->value.f);
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	case XML_SCHEMAS_DOUBLE: {
		char buf[40];
		/* |m| < 9007199254740992, -1075 <= e <= 970 */
		/*
		* TODO: Handle, NaN, INF, -INF. The format is not
		* yet conformant. The c type float does not cover
		* the whole range.
		*/
		snprintf(buf, 40, "%01.14e", val->value.d);
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	default:
	    *retValue = BAD_CAST xmlStrdup(BAD_CAST "???");
	    return (1);
    }
    if (*retValue == NULL)
	return(-1);
    return (0);
}